

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O1

Vec_Int_t * Pdr_ManDeriveFlopPriorities3(Gia_Man_t *p,int fMuxCtrls)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  void *pvVar6;
  void *__s;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  size_t __n;
  Gia_Obj_t *pGVar19;
  long lVar20;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pData1;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  Gia_ManCreateRefs(p);
  iVar18 = p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar13 = iVar18;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar13 << 2);
  }
  p_00->pArray = piVar4;
  iVar18 = p->nRegs;
  if (iVar18 < 1) {
    iVar13 = 1;
  }
  else {
    iVar12 = 0;
    iVar13 = 0;
    do {
      iVar14 = p->vCis->nSize;
      uVar11 = (iVar14 - iVar18) + iVar12;
      if (((int)uVar11 < 0) || (iVar14 <= (int)uVar11)) goto LAB_005e8880;
      iVar18 = p->vCis->pArray[uVar11];
      lVar5 = (long)iVar18;
      if ((lVar5 < 0) || (p->nObjs <= iVar18)) goto LAB_005e881f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar19 = p->pObjs + lVar5;
      Vec_IntPush(p_00,p->pRefs[lVar5]);
      pGVar7 = p->pObjs;
      if ((pGVar19 < pGVar7) || (pGVar7 + p->nObjs <= pGVar19)) goto LAB_005e883e;
      if (iVar13 <= p->pRefs[(int)((ulong)((long)pGVar19 - (long)pGVar7) >> 2) * -0x55555555]) {
        iVar13 = p->pRefs[(int)((ulong)((long)pGVar19 - (long)pGVar7) >> 2) * -0x55555555];
      }
      iVar12 = iVar12 + 1;
      iVar18 = p->nRegs;
    } while (iVar12 < iVar18);
    iVar13 = iVar13 + 1;
  }
  if (fMuxCtrls != 0) {
    iVar18 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
    if (iVar18 == 0) {
      pvVar6 = (void *)0x0;
    }
    else {
      pvVar6 = malloc((long)iVar18 * 4);
    }
    __n = (long)iVar18 << 2;
    memset(pvVar6,0,__n);
    if (iVar18 == 0) {
      __s = (void *)0x0;
    }
    else {
      __s = malloc(__n);
    }
    iVar18 = iVar18 * 0x20;
    memset(__s,0,__n);
    if (0 < p->nObjs) {
      lVar20 = 0;
      lVar5 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar19 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar20);
        if (((~*(uint *)pGVar19 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar19) &&
           (iVar12 = Gia_ObjIsMuxType(pGVar19), iVar12 != 0)) {
          pGVar7 = Gia_ObjRecognizeMux(pGVar19,&local_38,&local_40);
          pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 & 0xfffffffffffffffe);
          local_38 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
          local_40 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
          pGVar19 = p->pObjs;
          if ((pGVar7 < pGVar19) || (pGVar1 = pGVar19 + p->nObjs, pGVar1 <= pGVar7)) {
LAB_005e883e:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          lVar10 = ((long)pGVar7 - (long)pGVar19 >> 2) * -0x5555555555555555;
          uVar11 = (uint)lVar10;
          if (((int)uVar11 < 0) || (iVar18 <= (int)uVar11)) {
LAB_005e88be:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          puVar2 = (uint *)((long)pvVar6 + (ulong)(uVar11 >> 3 & 0xffffffc));
          *puVar2 = *puVar2 | 1 << ((byte)lVar10 & 0x1f);
          if ((local_38 < pGVar19) || (pGVar1 <= local_38)) goto LAB_005e883e;
          lVar10 = ((long)local_38 - (long)pGVar19 >> 2) * -0x5555555555555555;
          uVar11 = (uint)lVar10;
          if (((int)uVar11 < 0) || (iVar18 <= (int)uVar11)) goto LAB_005e88be;
          puVar2 = (uint *)((long)__s + (ulong)(uVar11 >> 3 & 0xffffffc));
          *puVar2 = *puVar2 | 1 << ((byte)lVar10 & 0x1f);
          if ((local_40 < pGVar19) || (pGVar1 <= local_40)) goto LAB_005e883e;
          lVar10 = ((long)local_40 - (long)pGVar19 >> 2) * -0x5555555555555555;
          uVar11 = (uint)lVar10;
          if (((int)uVar11 < 0) || (iVar18 <= (int)uVar11)) goto LAB_005e88be;
          puVar2 = (uint *)((long)__s + (ulong)(uVar11 >> 3 & 0xffffffc));
          *puVar2 = *puVar2 | 1 << ((byte)lVar10 & 0x1f);
        }
        lVar5 = lVar5 + 1;
        lVar20 = lVar20 + 0xc;
      } while (lVar5 < p->nObjs);
    }
    uVar15 = (ulong)(uint)p->nRegs;
    if (0 < p->nRegs) {
      pVVar8 = p->vCis;
      lVar5 = 0;
      do {
        iVar12 = pVVar8->nSize;
        uVar15 = (ulong)(uint)(iVar12 - (int)uVar15) + lVar5;
        iVar14 = (int)uVar15;
        if ((iVar14 < 0) || (iVar12 <= iVar14)) {
LAB_005e8880:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar11 = pVVar8->pArray[uVar15 & 0xffffffff];
        if (((int)uVar11 < 0) || (p->nObjs <= (int)uVar11)) {
LAB_005e881f:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar18 <= (int)uVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)pvVar6 + (ulong)(uVar11 >> 5) * 4) >> (uVar11 & 0x1f) & 1) != 0) {
          if (p_00->nSize <= lVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          p_00->pArray[lVar5] = p_00->pArray[lVar5] + iVar13;
        }
        lVar5 = lVar5 + 1;
        uVar15 = (ulong)p->nRegs;
      } while (lVar5 < (long)uVar15);
    }
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    iVar13 = iVar13 * 2 + 1;
  }
  piVar4 = (int *)malloc(0x10);
  iVar18 = 8;
  if (6 < iVar13 - 1U) {
    iVar18 = iVar13;
  }
  piVar4[1] = 0;
  *piVar4 = iVar18;
  pvVar6 = calloc((long)iVar18,0x10);
  *(void **)(piVar4 + 2) = pvVar6;
  piVar4[1] = iVar13;
  iVar18 = p_00->nSize;
  if (0 < (long)iVar18) {
    piVar9 = p_00->pArray;
    iVar13 = piVar4[1];
    lVar5 = 0;
    do {
      uVar11 = piVar9[lVar5];
      if (iVar13 <= (int)uVar11) {
        iVar14 = uVar11 + 1;
        iVar12 = iVar13 * 2;
        if (iVar13 * 2 <= iVar14) {
          iVar12 = iVar14;
        }
        iVar3 = *piVar4;
        iVar13 = iVar14;
        if (iVar3 < iVar12) {
          if (*(void **)(piVar4 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)iVar12 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(piVar4 + 2),(long)iVar12 << 4);
          }
          *(void **)(piVar4 + 2) = pvVar6;
          memset((void *)((long)iVar3 * 0x10 + (long)pvVar6),0,(long)(iVar12 - iVar3) << 4);
          *piVar4 = iVar12;
        }
      }
      if (((int)uVar11 < 0) || (iVar13 <= (int)uVar11)) {
        piVar4[1] = iVar13;
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush((Vec_Int_t *)((ulong)uVar11 * 0x10 + *(long *)(piVar4 + 2)),(int)lVar5);
      lVar5 = lVar5 + 1;
    } while (iVar18 != lVar5);
    piVar4[1] = iVar13;
  }
  iVar18 = p->nRegs;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar13 = iVar18;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar13;
  if (iVar13 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar8->pArray = piVar9;
  pVVar8->nSize = iVar18;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0,(long)iVar18 << 2);
  }
  iVar13 = piVar4[1];
  if ((long)iVar13 < 1) {
    iVar12 = 0;
  }
  else {
    lVar5 = *(long *)(piVar4 + 2);
    lVar20 = 0;
    iVar12 = 0;
    do {
      if (0 < *(int *)(lVar5 + 4 + lVar20 * 0x10)) {
        lVar16 = lVar20 * 0x10 + lVar5;
        lVar10 = *(long *)(lVar16 + 8);
        lVar17 = 0;
        do {
          iVar14 = *(int *)(lVar10 + lVar17 * 4);
          if (((long)iVar14 < 0) || (iVar18 <= iVar14)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar9[iVar14] = iVar12 + (int)lVar17;
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)(lVar16 + 4));
        iVar12 = iVar12 + (int)lVar17;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != iVar13);
  }
  if (iVar12 != iVar18) {
    __assert_fail("MaxEntry == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrMan.c"
                  ,0x86,"Vec_Int_t *Pdr_ManDeriveFlopPriorities3(Gia_Man_t *, int)");
  }
  iVar18 = *piVar4;
  if (0 < (long)iVar18) {
    lVar5 = *(long *)(piVar4 + 2);
    lVar20 = 0;
    do {
      pvVar6 = *(void **)(lVar5 + 8 + lVar20);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)(lVar5 + 8 + lVar20) = 0;
      }
      lVar20 = lVar20 + 0x10;
    } while ((long)iVar18 * 0x10 != lVar20);
  }
  if (*(void **)(piVar4 + 2) != (void *)0x0) {
    free(*(void **)(piVar4 + 2));
    piVar4[2] = 0;
    piVar4[3] = 0;
  }
  piVar4[0] = 0;
  piVar4[1] = 0;
  free(piVar4);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return pVVar8;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Structural analysis.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Pdr_ManDeriveFlopPriorities3( Gia_Man_t * p, int fMuxCtrls )
{
    int fDiscount = 0;
    Vec_Wec_t * vLevels;
    Vec_Int_t * vRes, * vLevel, * vCosts;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, k, Entry, MaxEntry = 0;
    Gia_ManCreateRefs(p);
    // discount references
    if ( fDiscount )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            p->pRefs[Gia_ObjId(p, pCtrl)]--;
            if ( pData0 == pData1 )
                p->pRefs[Gia_ObjId(p, pData0)]--;
        }
    }
    // create flop costs
    vCosts = Vec_IntAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Vec_IntPush( vCosts, Gia_ObjRefNum(p, pObj) );
        MaxEntry = Abc_MaxInt( MaxEntry, Gia_ObjRefNum(p, pObj) );
        //printf( "%d(%d) ", i, Gia_ObjRefNum(p, pObj) );
    }
    //printf( "\n" );
    MaxEntry++;
    // add costs due to MUX inputs
    if ( fMuxCtrls )
    {
        int fVerbose = 0;
        Vec_Bit_t * vCtrls = Vec_BitStart( Gia_ManObjNum(p) );
        Vec_Bit_t * vDatas = Vec_BitStart( Gia_ManObjNum(p) );
        Gia_Obj_t * pCtrl, * pData1, * pData0; 
        int nCtrls = 0, nDatas = 0, nBoth = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
            pCtrl  = Gia_Regular(pCtrl);
            pData1 = Gia_Regular(pData1);
            pData0 = Gia_Regular(pData0);
            Vec_BitWriteEntry( vCtrls, Gia_ObjId(p, pCtrl), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData1), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData0), 1 );
        }
        Gia_ManForEachRo( p, pObj, i )
            if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                Vec_IntAddToEntry( vCosts, i, MaxEntry );
            //else if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
            //    Vec_IntAddToEntry( vCosts, i,   MaxEntry );
        MaxEntry = 2*MaxEntry + 1;
        // print out
        if ( fVerbose )
        {
            Gia_ManForEachRo( p, pObj, i )
            {
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                    nCtrls++;
                if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nDatas++;
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) && Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nBoth++;
            }
            printf( "%10s : Flops = %5d.  Ctrls = %5d.  Datas = %5d.  Both = %5d.\n", Gia_ManName(p), Gia_ManRegNum(p), nCtrls, nDatas, nBoth );
        }
        Vec_BitFree( vCtrls );
        Vec_BitFree( vDatas );
    }
    // create levelized structure
    vLevels = Vec_WecStart( MaxEntry );
    Vec_IntForEachEntry( vCosts, Entry, i )
        Vec_WecPush( vLevels, Entry, i );
    // collect in this order
    MaxEntry = 0;
    vRes = Vec_IntStart( Gia_ManRegNum(p) );
    Vec_WecForEachLevel( vLevels, vLevel, i )
        Vec_IntForEachEntry( vLevel, Entry, k )
            Vec_IntWriteEntry( vRes, Entry, MaxEntry++ );
        //printf( "%d ", Gia_ObjRefNum(p, Gia_ManCi(p, Gia_ManPiNum(p)+Entry)) );
    //printf( "\n" );
    assert( MaxEntry == Gia_ManRegNum(p) );
    Vec_WecFree( vLevels );
    Vec_IntFree( vCosts );
    ABC_FREE( p->pRefs );
//Vec_IntPrint( vRes );
    return vRes;
}